

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

LinkedTargetDirs * __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories
          (LinkedTargetDirs *__return_storage_ptr__,cmCommonTargetGenerator *this,string *lang,
          string *config)

{
  cmGlobalCommonGenerator *pcVar1;
  pointer pIVar2;
  cmLocalCommonGenerator *this_00;
  pointer ppcVar3;
  bool bVar4;
  cmComputeLinkInformation *this_01;
  ItemVector *pIVar5;
  cmGeneratorTarget *linkee;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  pointer ppcVar7;
  pointer pIVar8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  anon_class_56_7_aa25191b addLinkedTarget;
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  local_c0;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  direct_emitted;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  forward_emitted;
  
  (__return_storage_ptr__->Forward).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Forward).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  forward_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &forward_emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  forward_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  forward_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  forward_emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  direct_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &direct_emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  direct_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  direct_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  direct_emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->Direct).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Forward).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Direct).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Direct).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = this->GlobalCommonGenerator;
  direct_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       direct_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  forward_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       forward_emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_01 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,config);
  if (this_01 != (cmComputeLinkInformation *)0x0) {
    addLinkedTarget.direct_emitted = &direct_emitted;
    addLinkedTarget.forward_emitted = &forward_emitted;
    addLinkedTarget.this = this;
    addLinkedTarget.lang = lang;
    addLinkedTarget.config = config;
    addLinkedTarget.dirs = __return_storage_ptr__;
    addLinkedTarget.gg = pcVar1;
    pIVar5 = cmComputeLinkInformation::GetItems(this_01);
    pIVar2 = (pIVar5->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar8 = (pIVar5->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar2; pIVar8 = pIVar8 + 1)
    {
      if (pIVar8->Target == (cmGeneratorTarget *)0x0) {
        if ((pIVar8->ObjectSource != (cmSourceFile *)0x0) &&
           (__y._M_str = "Fortran", __y._M_len = 7, __x._M_str = (lang->_M_dataplus)._M_p,
           __x._M_len = lang->_M_string_length, bVar4 = std::operator==(__x,__y), bVar4)) {
          this_00 = this->LocalCommonGenerator;
          cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)&local_c0,pIVar8->ObjectSource);
          linkee = cmLocalGenerator::FindGeneratorTargetToUse
                             (&this_00->super_cmLocalGenerator,(string *)&local_c0);
          GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                    (&addLinkedTarget,linkee,Yes);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      else {
        GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                  (&addLinkedTarget,pIVar8->Target,No);
      }
    }
    pvVar6 = cmComputeLinkInformation::GetExternalObjectTargets(this_01);
    ppcVar3 = (pvVar6->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar7 = (pvVar6->
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar3;
        ppcVar7 = ppcVar7 + 1) {
      GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()(&addLinkedTarget,*ppcVar7,No)
      ;
    }
    __y_00._M_str = "Fortran";
    __y_00._M_len = 7;
    __x_00._M_str = (lang->_M_dataplus)._M_p;
    __x_00._M_len = lang->_M_string_length;
    bVar4 = std::operator==(__x_00,__y_00);
    if (bVar4) {
      cmGeneratorTarget::GetSourceObjectLibraries
                ((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)&local_c0,this->GeneratorTarget,config);
      for (; (_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_c0._M_impl.super__Rb_tree_header;
          local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               std::_Rb_tree_increment(local_c0._M_impl.super__Rb_tree_header._M_header._M_left)) {
        GetLinkedTargetDirectories::anon_class_56_7_aa25191b::operator()
                  (&addLinkedTarget,
                   *(cmGeneratorTarget **)
                    (local_c0._M_impl.super__Rb_tree_header._M_header._M_left + 1),Yes);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
      ::~_Rb_tree(&local_c0);
    }
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&direct_emitted._M_t);
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&forward_emitted._M_t);
  return __return_storage_ptr__;
}

Assistant:

cmCommonTargetGenerator::LinkedTargetDirs
cmCommonTargetGenerator::GetLinkedTargetDirectories(
  const std::string& lang, const std::string& config) const
{
  LinkedTargetDirs dirs;
  std::set<cmGeneratorTarget const*> forward_emitted;
  std::set<cmGeneratorTarget const*> direct_emitted;
  cmGlobalCommonGenerator* const gg = this->GlobalCommonGenerator;

  enum class Forwarding
  {
    Yes,
    No
  };

  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(config)) {
    auto addLinkedTarget =
      [this, &lang, &config, &dirs, &direct_emitted, &forward_emitted,
       gg](cmGeneratorTarget const* linkee, Forwarding forward) {
        if (linkee &&
            !linkee->IsImported()
            // Skip targets that build after this one in a static lib cycle.
            && gg->TargetOrderIndexLess(linkee, this->GeneratorTarget)
            // We can ignore the INTERFACE_LIBRARY items because
            // Target->GetLinkInformation already processed their
            // link interface and they don't have any output themselves.
            && (linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY
                // Synthesized targets may have relevant rules.
                || linkee->IsSynthetic()) &&
            ((lang == "CXX"_s && linkee->HaveCxx20ModuleSources()) ||
             (lang == "Fortran"_s && linkee->HaveFortranSources(config)))) {
          cmLocalGenerator* lg = linkee->GetLocalGenerator();
          std::string di = cmStrCat(lg->GetCurrentBinaryDirectory(), '/',
                                    lg->GetTargetDirectory(linkee));
          if (lg->GetGlobalGenerator()->IsMultiConfig()) {
            di = cmStrCat(di, '/', config);
          }
          if (forward == Forwarding::Yes &&
              forward_emitted.insert(linkee).second) {
            dirs.Forward.push_back(di);
          }
          if (direct_emitted.insert(linkee).second) {
            dirs.Direct.emplace_back(di);
          }
        }
      };
    for (auto const& item : cli->GetItems()) {
      if (item.Target) {
        addLinkedTarget(item.Target, Forwarding::No);
      } else if (item.ObjectSource && lang == "Fortran"_s
                 /* Object source files do not have a language associated with
                    them. */
                 /* && item.ObjectSource->GetLanguage() == "Fortran"_s*/) {
        // Fortran modules provided by `$<TARGET_OBJECTS>` as linked items
        // should be collated for use in this target.
        addLinkedTarget(this->LocalCommonGenerator->FindGeneratorTargetToUse(
                          item.ObjectSource->GetObjectLibrary()),
                        Forwarding::Yes);
      }
    }
    for (cmGeneratorTarget const* target : cli->GetExternalObjectTargets()) {
      addLinkedTarget(target, Forwarding::No);
    }
    if (lang == "Fortran"_s) {
      // Fortran modules provided by `$<TARGET_OBJECTS>` as sources should be
      // collated for use in this target.
      for (cmGeneratorTarget const* target :
           this->GeneratorTarget->GetSourceObjectLibraries(config)) {
        addLinkedTarget(target, Forwarding::Yes);
      }
    }
  }
  return dirs;
}